

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

Reference * __thiscall
czh::node::Node::get<czh::value::Reference>
          (Reference *__return_storage_ptr__,Node *this,source_location *l)

{
  bool bVar1;
  variant_alternative_t<1UL,_variant<NodeData,_Value>_> *this_00;
  Node *this_01;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  assert_value(this,l);
  this_00 = std::get<1ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
  if (*(__index_type *)
       ((long)&(this_00->value).
               super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
               .
               super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
       + 0x20) == '\x06') {
    bVar1 = std::type_info::operator==
                      ((type_info *)&value::Reference::typeinfo,
                       (type_info *)&value::Reference::typeinfo);
    if (!bVar1) {
      local_d8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001956b8;
      value::Value::internal_get<czh::value::Reference>(&local_f8,this_00);
      this_01 = get_end_of_list_of_ref(this,(Reference *)&local_f8,l);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Can not get a circular reference.",
                 (allocator<char> *)&local_d8);
      if (this_01 == (Node *)0x0) {
        report_error(&local_f8,&this->czh_token,l);
      }
      std::__cxx11::string::~string((string *)&local_f8);
      local_f8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001956d0;
      get<czh::value::Reference>(__return_storage_ptr__,this_01,(source_location *)&local_f8);
      return __return_storage_ptr__;
    }
    if (*(__index_type *)
         ((long)&(this_00->value).
                 super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                 .
                 super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
         + 0x20) == '\x06') goto LAB_0011d699;
  }
  local_38._M_len = 0x4a;
  local_38._M_str = "std::string_view czh::value::details::nameof() [T = czh::value::Reference]";
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_98,&local_38,&local_f9);
  std::operator+(&local_78,"The value is not \'",&local_98);
  std::operator+(&local_58,&local_78,"\'.[Actual T = \'");
  value::Value::get_typename_abi_cxx11_(&local_b8,this_00);
  std::operator+(&local_d8,&local_58,&local_b8);
  std::operator+(&local_f8,&local_d8,"\'].");
  report_error(&local_f8,&this->czh_token,l);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
LAB_0011d699:
  local_f8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001956e8;
  value::Value::internal_get<czh::value::Reference>(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

T get(const std::source_location &l =
    std::source_location::current()) const
    {
      assert_value(l);
      auto &value = std::get<Value>(data);
      if (value.is<value::Reference>() && typeid(T) != typeid(value::Reference))
      {
        auto ptr = get_end_of_list_of_ref(value.get<value::Reference>(), l);
        assert_true(ptr != nullptr, "Can not get a circular reference.", czh_token, l);
        return ptr->get<T>();
      }
  
      if (!value.can_get<T>())
      {
        report_error("The value is not '" + std::string(value::details::nameof<T>()) + "'.[Actual T = '"
                     + value.get_typename() + "'].", czh_token, l);
      }
      return value.get<T>();
    }